

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.cpp
# Opt level: O1

int GPIO::GPIOBase::init(EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unsigned_long uVar2;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> uVar3;
  uint e;
  unsigned_long *in_RAX;
  __uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true> __s;
  long lVar4;
  runtime_error *this;
  size_t in_RCX;
  unsigned_long *puVar5;
  int __fd;
  bool bVar6;
  AutoFile fd;
  AutoFile local_6c;
  string local_68;
  string local_48;
  
  if (peripherals_base == 0) {
    if (simulate) {
      peripherals_base = 0x20000000;
      peripherals_size = 0x1000000;
      __s.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)
           operator_new__(0x2000000);
      memset((void *)__s.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,0,0x2000000);
      uVar3 = peripherals_sim;
      bVar6 = (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)
              peripherals_sim._M_t.
              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
      peripherals_sim._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
           (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
           __s.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      if (bVar6) {
        operator_delete__((void *)uVar3._M_t.
                                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                  .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
      }
      peripherals = (unsigned_long *)
                    peripherals_sim._M_t.
                    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t
                    .super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    }
    else {
      local_6c.m_fd = -1;
      if (want_full_mapping) {
        bVar6 = false;
      }
      else {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"/dev/gpiomem","");
        bVar6 = Tools::AutoFile::open_nothrow(&local_6c,&local_48,0x101002);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar6 == false) {
        paVar1 = &local_68.field_2;
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"/proc/device-tree/soc/ranges","");
        bVar6 = Tools::AutoFile::open_nothrow(&local_6c,&local_68,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if (bVar6) {
          Tools::AutoFile::seek(&local_6c,4,0);
          Tools::AutoFile::read(&local_6c,0x117588,(void *)0x8,in_RCX);
          if (peripherals_base == 0) {
            Tools::AutoFile::read(&local_6c,0x117588,(void *)0x8,in_RCX);
          }
          __fd = 0x117590;
          Tools::AutoFile::read(&local_6c,0x117590,(void *)0x8,in_RCX);
          Tools::AutoFile::close(&local_6c,__fd);
          lVar4 = 7;
          puVar5 = &peripherals_base;
          do {
            uVar2 = *puVar5;
            *(undefined1 *)puVar5 = *(undefined1 *)((long)&peripherals_base + lVar4);
            *(char *)((long)&peripherals_base + lVar4) = (char)uVar2;
            lVar4 = lVar4 + -1;
            puVar5 = (unsigned_long *)((long)puVar5 + 1);
          } while (lVar4 != 3);
          lVar4 = 7;
          puVar5 = &peripherals_size;
          do {
            uVar2 = *puVar5;
            *(undefined1 *)puVar5 = *(undefined1 *)((long)&peripherals_size + lVar4);
            *(char *)((long)&peripherals_size + lVar4) = (char)uVar2;
            lVar4 = lVar4 + -1;
            puVar5 = (unsigned_long *)((long)puVar5 + 1);
          } while (lVar4 != 3);
        }
        else {
          peripherals_base = 0x20000000;
          peripherals_size = 0x1000000;
        }
        if (peripherals_base == 0) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"cannot read SOC peripherals base address");
LAB_0010d4bc:
          *(undefined ***)this = &PTR__runtime_error_001169a8;
          __cxa_throw(this,&GPIOError::typeinfo,std::runtime_error::~runtime_error);
        }
        if (peripherals_size == 0) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"cannot read SOC peripherals size");
          goto LAB_0010d4bc;
        }
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"/dev/mem","");
        Tools::AutoFile::open(&local_6c,(char *)&local_68,0x101002);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        peripherals = (unsigned_long *)
                      mmap((void *)0x0,peripherals_size,3,1,local_6c.m_fd,peripherals_base);
        if (peripherals == (unsigned_long *)0xffffffffffffffff) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"mmap failed on /dev/mem");
          goto LAB_0010d4bc;
        }
      }
      else {
        gpio_addr = (unsigned_long *)mmap((void *)0x0,0x1000,3,1,local_6c.m_fd,0);
        if (gpio_addr == (unsigned_long *)0xffffffffffffffff) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"mmap failed on /dev/gpiomem");
          goto LAB_0010d4bc;
        }
        gpio_only = true;
      }
      Tools::AutoFile::~AutoFile(&local_6c);
    }
    if (gpio_only == true) {
      in_RAX = (unsigned_long *)0x0;
      peripherals = (unsigned_long *)0x0;
      pwm_addr = (unsigned_long *)0x0;
      clk_addr = (unsigned_long *)0x0;
      pads_addr = (unsigned_long *)0x0;
      spi0_addr = (unsigned_long *)0x0;
      bsc0_addr = (unsigned_long *)0x0;
      bsc1_addr = (unsigned_long *)0x0;
      st_addr = in_RAX;
    }
    else {
      gpio_addr = peripherals + 0x40000;
      pwm_addr = peripherals + 0x41800;
      clk_addr = peripherals + 0x20200;
      pads_addr = peripherals + 0x20000;
      spi0_addr = peripherals + 0x40800;
      bsc0_addr = peripherals + 0x40a00;
      bsc1_addr = peripherals + 0x100800;
      in_RAX = peripherals + 0x600;
      st_addr = in_RAX;
    }
  }
  return (int)in_RAX;
}

Assistant:

void GPIOBase::init()
{
    if (!peripherals_base) {

#ifndef __linux
        // this GPIO is only existing in Linux type operating systems. When compiling e.g. on a Mac,
        // force simulation mode for debugging.

        simulate = true;
#endif

        // check if we are in simulation mode (probably on another hardware, like a PC or a Mac)

        if (simulate) {

            peripherals_base = 0x20000000;
            peripherals_size = 0x01000000;

            peripherals_sim = std::make_unique<unsigned long[]>(peripherals_size / 4);
            peripherals = peripherals_sim.get();

        } else {

            // use /dev/gpiomem if available (does not need root, only group gpio, but we lose access on
            // PWM and all other buses than gpio.
            // however - as all higher level protocols are well handled by Linux modules, this should not
            // be an issue. Only problem is the pwm clock frequency, which cannot be set through a kernel
            // module. See /boot/overlay/README.)

            Tools::AutoFile fd;

            if (!want_full_mapping && fd.open_nothrow("/dev/gpiomem", O_RDWR | O_SYNC)) {

                gpio_addr = static_cast<volatile unsigned long*>(::mmap(nullptr, GPIO_MEM_BLOCK_SIZE,
                                                                        (PROT_READ | PROT_WRITE),
                                                                        MAP_SHARED, *fd, 0));
                if (gpio_addr == MAP_FAILED) throw GPIOError("mmap failed on /dev/gpiomem");
                
                gpio_only = true;

            } else {

                // Try to determine peripherals_base and peripherals_size

                // The peripherals base address is announced in /proc/device-tree/soc/ranges with
                // an offset of 4 and a size of 4, followed by the size.

                // If the file does not exist it shall be assumed 0x20000000 and the size with 0x01000000
                // (which was the address on the raspi 1 versions)

                if (!fd.open_nothrow("/proc/device-tree/soc/ranges", O_RDONLY)) {

                    // this is apparently a raspi 1 with an old kernel

                    peripherals_base = 0x20000000;
                    peripherals_size = 0x01000000;

                } else {

                    // else read base address at pos 4
                    fd.seek(4, SEEK_SET);
                    fd.read(peripherals_base);

					if (peripherals_base == 0) {
						// on the raspberry pi 4 the base is at pos 8, not 4,
						// and the size is at pos 12, not 8
						// see https://github.com/raspberrypi/userland/blob/master/host_applications/linux/libs/bcm_host/bcm_host.c
						// in bcm_host_get_peripheral_address()
						fd.read(peripherals_base);
					}

                    fd.read(peripherals_size);

                    fd.close();

                    Tools::byteswap(peripherals_base);
                    Tools::byteswap(peripherals_size);

                }

                if (!peripherals_base) throw GPIOError("cannot read SOC peripherals base address");
                if (!peripherals_size) throw GPIOError("cannot read SOC peripherals size");

                fd.open("/dev/mem", O_RDWR | O_SYNC);

                peripherals = static_cast<volatile unsigned long*>(::mmap(nullptr, peripherals_size,
                                                                          (PROT_READ | PROT_WRITE),
                                                                          MAP_SHARED,
                                                                          *fd, peripherals_base));
                if (peripherals == MAP_FAILED) throw GPIOError("mmap failed on /dev/mem");

            }

        }

        if (gpio_only) {

            peripherals = nullptr;
            pwm_addr    = nullptr;
            clk_addr    = nullptr;
            pads_addr   = nullptr;
            spi0_addr   = nullptr;
            bsc0_addr   = nullptr;
            bsc1_addr   = nullptr;
            st_addr     = nullptr;

        } else {

            gpio_addr   = peripherals + GPIO_BASE  / sizeof(peripherals);
            pwm_addr    = peripherals + GPIO_PWM   / sizeof(peripherals);
            clk_addr    = peripherals + CLOCK_BASE / sizeof(peripherals);
            pads_addr   = peripherals + GPIO_PADS  / sizeof(peripherals);
            spi0_addr   = peripherals + SPI0_BASE  / sizeof(peripherals);
            bsc0_addr   = peripherals + BSC0_BASE  / sizeof(peripherals);
            bsc1_addr   = peripherals + BSC1_BASE  / sizeof(peripherals);
            st_addr     = peripherals + ST_BASE    / sizeof(peripherals);
            
        }
    }
}